

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

config * Configlist_addbasis(rule *rp,int dot)

{
  config *data;
  char *__s;
  size_t nByte;
  config model;
  config local_68;
  
  if (basisend == (config **)0x0) {
    __assert_fail("basisend!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                  ,0x5a6,"struct config *Configlist_addbasis(struct rule *, int)");
  }
  if (currentend != (config **)0x0) {
    local_68.rp = rp;
    local_68.dot = dot;
    data = Configtable_find(&local_68);
    if (data == (config *)0x0) {
      data = (config *)lemon_malloc(0x48);
      *(undefined8 *)&data->field_0xc = 0;
      *(undefined8 *)((long)&data->fws + 4) = 0;
      *(undefined8 *)((long)&data->fplp + 4) = 0;
      *(undefined8 *)((long)&data->bplp + 4) = 0;
      *(undefined8 *)((long)&data->stp + 4) = 0;
      *(undefined8 *)&data->field_0x34 = 0;
      data->next = (config *)0x0;
      data->bp = (config *)0x0;
      data->rp = rp;
      data->dot = dot;
      nByte = (size_t)size;
      __s = (char *)lemon_malloc(nByte);
      memset(__s,0,nByte);
      data->fws = __s;
      data->fplp = (plink *)0x0;
      data->bplp = (plink *)0x0;
      data->stp = (state *)0x0;
      data->next = (config *)0x0;
      data->bp = (config *)0x0;
      *currentend = data;
      currentend = &data->next;
      *basisend = data;
      basisend = &data->bp;
      Configtable_insert(data);
    }
    return data;
  }
  __assert_fail("currentend!=0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwenn[P]lemon-rs/third_party/lemon/lemon.c"
                ,0x5a7,"struct config *Configlist_addbasis(struct rule *, int)");
}

Assistant:

struct config *Configlist_addbasis(struct rule *rp, int dot)
{
  struct config *cfp, model;

  assert( basisend!=0 );
  assert( currentend!=0 );
  model.rp = rp;
  model.dot = dot;
  cfp = Configtable_find(&model);
  if( cfp==0 ){
    cfp = newconfig();
    cfp->rp = rp;
    cfp->dot = dot;
    cfp->fws = SetNew();
    cfp->stp = 0;
    cfp->fplp = cfp->bplp = 0;
    cfp->next = 0;
    cfp->bp = 0;
    *currentend = cfp;
    currentend = &cfp->next;
    *basisend = cfp;
    basisend = &cfp->bp;
    Configtable_insert(cfp);
  }
  return cfp;
}